

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void spirv_cross::ParsedIR::sanitize_identifier
               (string *name,bool member,bool allow_reserved_prefixes)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  size_type sVar6;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar3 = is_valid_identifier(name);
  if (!bVar3) {
    ::std::__cxx11::string::find((char)name,0x28);
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    if (local_40._M_string_length != 0) {
      if ((byte)(*local_40._M_dataplus._M_p - 0x30U) < 10) {
        *local_40._M_dataplus._M_p = '_';
      }
      if (local_40._M_string_length != 0) {
        sVar6 = 0;
        do {
          bVar1 = local_40._M_dataplus._M_p[sVar6];
          if (((bVar1 != 0x5f) && (9 < (byte)(bVar1 - 0x30))) &&
             (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
            local_40._M_dataplus._M_p[sVar6] = '_';
          }
          sVar6 = sVar6 + 1;
        } while (local_40._M_string_length != sVar6);
      }
      _Var4._M_p = local_40._M_dataplus._M_p;
      if (local_40._M_string_length != 0) {
        bVar3 = false;
        _Var5._M_p = local_40._M_dataplus._M_p;
        do {
          cVar2 = *_Var5._M_p;
          if (!(bool)(bVar3 & cVar2 == '_')) {
            if (_Var5._M_p != _Var4._M_p) {
              *_Var4._M_p = cVar2;
            }
            _Var4._M_p = _Var4._M_p + 1;
            bVar3 = cVar2 == '_';
          }
          _Var5._M_p = _Var5._M_p + 1;
        } while (_Var5._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
      }
      local_40._M_string_length = (long)_Var4._M_p - (long)local_40._M_dataplus._M_p;
      *_Var4._M_p = '\0';
    }
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  bVar3 = is_reserved_identifier(name,member,allow_reserved_prefixes);
  if (bVar3) {
    bVar3 = is_reserved_prefix(name);
    __lhs = "_RESERVED_IDENTIFIER_FIXUP";
    if (bVar3) {
      __lhs = "_RESERVED_IDENTIFIER_FIXUP_";
    }
    ::std::operator+(&local_40,__lhs,name);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ParsedIR::sanitize_identifier(std::string &name, bool member, bool allow_reserved_prefixes)
{
	if (!is_valid_identifier(name))
		name = ensure_valid_identifier(name);
	if (is_reserved_identifier(name, member, allow_reserved_prefixes))
		name = make_unreserved_identifier(name);
}